

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UDateTimePatternConflict __thiscall
icu_63::DateTimePatternGenerator::addPatternWithSkeleton
          (DateTimePatternGenerator *this,UnicodeString *pattern,UnicodeString *skeletonToUse,
          UBool override,UnicodeString *conflictingPattern,UErrorCode *status)

{
  UnicodeString *pUVar1;
  UDateTimePatternConflict UVar2;
  UBool entryHadSpecifiedSkeleton;
  UnicodeString *local_1a8;
  PtnSkeleton *entrySpecifiedSkeleton;
  UnicodeString basePattern;
  PtnSkeleton skeleton;
  DateTimeMatcher matcher;
  
  if (U_ZERO_ERROR < this->internalErrorCode) {
    *status = this->internalErrorCode;
    return UDATPG_NO_CONFLICT;
  }
  basePattern.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  basePattern.fUnion.fStackFields.fLengthAndFlags = 2;
  skeleton._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
  skeleton.original.chars[0] = '\0';
  skeleton.original.chars[1] = '\0';
  skeleton.original.chars[2] = '\0';
  skeleton.original.chars[3] = '\0';
  skeleton.original.chars[4] = '\0';
  skeleton.original.chars[5] = '\0';
  skeleton.original.chars[6] = '\0';
  skeleton.original.chars[7] = '\0';
  skeleton.original.chars[8] = '\0';
  skeleton.original.chars[9] = '\0';
  skeleton.original.chars[10] = '\0';
  skeleton.original.chars[0xb] = '\0';
  skeleton.original.chars[0xc] = '\0';
  skeleton.original.chars[0xd] = '\0';
  skeleton.original.chars[0xe] = '\0';
  skeleton.original.chars[0xf] = '\0';
  skeleton.original.lengths[0] = '\0';
  skeleton.original.lengths[1] = '\0';
  skeleton.original.lengths[2] = '\0';
  skeleton.original.lengths[3] = '\0';
  skeleton.original.lengths[4] = '\0';
  skeleton.original.lengths[5] = '\0';
  skeleton.original.lengths[6] = '\0';
  skeleton.original.lengths[7] = '\0';
  skeleton.original.lengths[8] = '\0';
  skeleton.original.lengths[9] = '\0';
  skeleton.original.lengths[10] = '\0';
  skeleton.original.lengths[0xb] = '\0';
  skeleton.original.lengths[0xc] = '\0';
  skeleton.original.lengths[0xd] = '\0';
  skeleton.original.lengths[0xe] = '\0';
  skeleton.original.lengths[0xf] = '\0';
  skeleton.baseOriginal.chars[0] = '\0';
  skeleton.baseOriginal.chars[1] = '\0';
  skeleton.baseOriginal.chars[2] = '\0';
  skeleton.baseOriginal.chars[3] = '\0';
  skeleton.baseOriginal.chars[4] = '\0';
  skeleton.baseOriginal.chars[5] = '\0';
  skeleton.baseOriginal.chars[6] = '\0';
  skeleton.baseOriginal.chars[7] = '\0';
  skeleton.baseOriginal.chars[8] = '\0';
  skeleton.baseOriginal.chars[9] = '\0';
  skeleton.baseOriginal.chars[10] = '\0';
  skeleton.baseOriginal.chars[0xb] = '\0';
  skeleton.baseOriginal.chars[0xc] = '\0';
  skeleton.baseOriginal.chars[0xd] = '\0';
  skeleton.baseOriginal.chars[0xe] = '\0';
  skeleton.baseOriginal.chars[0xf] = '\0';
  skeleton.baseOriginal.lengths[0] = '\0';
  skeleton.baseOriginal.lengths[1] = '\0';
  skeleton.baseOriginal.lengths[2] = '\0';
  skeleton.baseOriginal.lengths[3] = '\0';
  skeleton.baseOriginal.lengths[4] = '\0';
  skeleton.baseOriginal.lengths[5] = '\0';
  skeleton.baseOriginal.lengths[6] = '\0';
  skeleton.baseOriginal.lengths[7] = '\0';
  skeleton.baseOriginal.lengths[8] = '\0';
  skeleton.baseOriginal.lengths[9] = '\0';
  skeleton.baseOriginal.lengths[10] = '\0';
  skeleton.baseOriginal.lengths[0xb] = '\0';
  skeleton.baseOriginal.lengths[0xc] = '\0';
  skeleton.baseOriginal.lengths[0xd] = '\0';
  skeleton.baseOriginal.lengths[0xe] = '\0';
  skeleton.baseOriginal.lengths[0xf] = '\0';
  matcher._vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_00463840;
  matcher.skeleton._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_004638a8;
  matcher.skeleton.original.chars[0] = '\0';
  matcher.skeleton.original.chars[1] = '\0';
  matcher.skeleton.original.chars[2] = '\0';
  matcher.skeleton.original.chars[3] = '\0';
  matcher.skeleton.original.chars[4] = '\0';
  matcher.skeleton.original.chars[5] = '\0';
  matcher.skeleton.original.chars[6] = '\0';
  matcher.skeleton.original.chars[7] = '\0';
  matcher.skeleton.original.chars[8] = '\0';
  matcher.skeleton.original.chars[9] = '\0';
  matcher.skeleton.original.chars[10] = '\0';
  matcher.skeleton.original.chars[0xb] = '\0';
  matcher.skeleton.original.chars[0xc] = '\0';
  matcher.skeleton.original.chars[0xd] = '\0';
  matcher.skeleton.original.chars[0xe] = '\0';
  matcher.skeleton.original.chars[0xf] = '\0';
  matcher.skeleton.original.lengths[0] = '\0';
  matcher.skeleton.original.lengths[1] = '\0';
  matcher.skeleton.original.lengths[2] = '\0';
  matcher.skeleton.original.lengths[3] = '\0';
  matcher.skeleton.original.lengths[4] = '\0';
  matcher.skeleton.original.lengths[5] = '\0';
  matcher.skeleton.original.lengths[6] = '\0';
  matcher.skeleton.original.lengths[7] = '\0';
  matcher.skeleton.original.lengths[8] = '\0';
  matcher.skeleton.original.lengths[9] = '\0';
  matcher.skeleton.original.lengths[10] = '\0';
  matcher.skeleton.original.lengths[0xb] = '\0';
  matcher.skeleton.original.lengths[0xc] = '\0';
  matcher.skeleton.original.lengths[0xd] = '\0';
  matcher.skeleton.original.lengths[0xe] = '\0';
  matcher.skeleton.original.lengths[0xf] = '\0';
  matcher.skeleton.baseOriginal.chars[0] = '\0';
  matcher.skeleton.baseOriginal.chars[1] = '\0';
  matcher.skeleton.baseOriginal.chars[2] = '\0';
  matcher.skeleton.baseOriginal.chars[3] = '\0';
  matcher.skeleton.baseOriginal.chars[4] = '\0';
  matcher.skeleton.baseOriginal.chars[5] = '\0';
  matcher.skeleton.baseOriginal.chars[6] = '\0';
  matcher.skeleton.baseOriginal.chars[7] = '\0';
  matcher.skeleton.baseOriginal.chars[8] = '\0';
  matcher.skeleton.baseOriginal.chars[9] = '\0';
  matcher.skeleton.baseOriginal.chars[10] = '\0';
  matcher.skeleton.baseOriginal.chars[0xb] = '\0';
  matcher.skeleton.baseOriginal.chars[0xc] = '\0';
  matcher.skeleton.baseOriginal.chars[0xd] = '\0';
  matcher.skeleton.baseOriginal.chars[0xe] = '\0';
  matcher.skeleton.baseOriginal.chars[0xf] = '\0';
  matcher.skeleton.baseOriginal.lengths[0] = '\0';
  matcher.skeleton.baseOriginal.lengths[1] = '\0';
  matcher.skeleton.baseOriginal.lengths[2] = '\0';
  matcher.skeleton.baseOriginal.lengths[3] = '\0';
  matcher.skeleton.baseOriginal.lengths[4] = '\0';
  matcher.skeleton.baseOriginal.lengths[5] = '\0';
  matcher.skeleton.baseOriginal.lengths[6] = '\0';
  matcher.skeleton.baseOriginal.lengths[7] = '\0';
  matcher.skeleton.baseOriginal.lengths[8] = '\0';
  matcher.skeleton.baseOriginal.lengths[9] = '\0';
  matcher.skeleton.baseOriginal.lengths[10] = '\0';
  matcher.skeleton.baseOriginal.lengths[0xb] = '\0';
  matcher.skeleton.baseOriginal.lengths[0xc] = '\0';
  matcher.skeleton.baseOriginal.lengths[0xd] = '\0';
  matcher.skeleton.baseOriginal.lengths[0xe] = '\0';
  matcher.skeleton.baseOriginal.lengths[0xf] = '\0';
  pUVar1 = skeletonToUse;
  if (skeletonToUse == (UnicodeString *)0x0) {
    pUVar1 = pattern;
  }
  local_1a8 = pattern;
  DateTimeMatcher::set(&matcher,pUVar1,this->fp,&skeleton);
  DateTimeMatcher::getBasePattern(&matcher,&basePattern);
  pUVar1 = PatternMap::getPatternFromBasePattern
                     (this->patternMap,&basePattern,&entryHadSpecifiedSkeleton);
  UVar2 = UDATPG_NO_CONFLICT;
  if ((pUVar1 != (UnicodeString *)0x0) &&
     ((skeletonToUse != (UnicodeString *)0x0 && override == '\0' ||
      (entryHadSpecifiedSkeleton == '\0')))) {
    icu_63::UnicodeString::operator=(conflictingPattern,pUVar1);
    UVar2 = UDATPG_BASE_CONFLICT;
    if (override == '\0') goto LAB_002d658f;
  }
  entrySpecifiedSkeleton = (PtnSkeleton *)0x0;
  pUVar1 = PatternMap::getPatternFromSkeleton(this->patternMap,&skeleton,&entrySpecifiedSkeleton);
  if (pUVar1 != (UnicodeString *)0x0) {
    icu_63::UnicodeString::operator=(conflictingPattern,pUVar1);
    UVar2 = UDATPG_CONFLICT;
    if ((override == '\0') ||
       ((skeletonToUse != (UnicodeString *)0x0 && (entrySpecifiedSkeleton != (PtnSkeleton *)0x0))))
    goto LAB_002d658f;
  }
  PatternMap::add(this->patternMap,&basePattern,&skeleton,local_1a8,
                  skeletonToUse != (UnicodeString *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar2 = UDATPG_NO_CONFLICT;
  }
LAB_002d658f:
  icu_63::UnicodeString::~UnicodeString(&basePattern);
  return UVar2;
}

Assistant:

UDateTimePatternConflict
DateTimePatternGenerator::addPatternWithSkeleton(
    const UnicodeString& pattern,
    const UnicodeString* skeletonToUse,
    UBool override,
    UnicodeString& conflictingPattern,
    UErrorCode& status)
{
    if (U_FAILURE(internalErrorCode)) {
        status = internalErrorCode;
        return UDATPG_NO_CONFLICT;
    }

    UnicodeString basePattern;
    PtnSkeleton   skeleton;
    UDateTimePatternConflict conflictingStatus = UDATPG_NO_CONFLICT;

    DateTimeMatcher matcher;
    if ( skeletonToUse == nullptr ) {
        matcher.set(pattern, fp, skeleton);
        matcher.getBasePattern(basePattern);
    } else {
        matcher.set(*skeletonToUse, fp, skeleton); // no longer trims skeleton fields to max len 3, per #7930
        matcher.getBasePattern(basePattern); // or perhaps instead: basePattern = *skeletonToUse;
    }
    // We only care about base conflicts - and replacing the pattern associated with a base - if:
    // 1. the conflicting previous base pattern did *not* have an explicit skeleton; in that case the previous
    // base + pattern combination was derived from either (a) a canonical item, (b) a standard format, or
    // (c) a pattern specified programmatically with a previous call to addPattern (which would only happen
    // if we are getting here from a subsequent call to addPattern).
    // 2. a skeleton is specified for the current pattern, but override=false; in that case we are checking
    // availableFormats items from root, which should not override any previous entry with the same base.
    UBool entryHadSpecifiedSkeleton;
    const UnicodeString *duplicatePattern = patternMap->getPatternFromBasePattern(basePattern, entryHadSpecifiedSkeleton);
    if (duplicatePattern != nullptr && (!entryHadSpecifiedSkeleton || (skeletonToUse != nullptr && !override))) {
        conflictingStatus = UDATPG_BASE_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override) {
            return conflictingStatus;
        }
    }
    // The only time we get here with override=true and skeletonToUse!=null is when adding availableFormats
    // items from CLDR data. In that case, we don't want an item from a parent locale to replace an item with
    // same skeleton from the specified locale, so skip the current item if skeletonWasSpecified is true for
    // the previously-specified conflicting item.
    const PtnSkeleton* entrySpecifiedSkeleton = nullptr;
    duplicatePattern = patternMap->getPatternFromSkeleton(skeleton, &entrySpecifiedSkeleton);
    if (duplicatePattern != nullptr ) {
        conflictingStatus = UDATPG_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override || (skeletonToUse != nullptr && entrySpecifiedSkeleton != nullptr)) {
            return conflictingStatus;
        }
    }
    patternMap->add(basePattern, skeleton, pattern, skeletonToUse != nullptr, status);
    if(U_FAILURE(status)) {
        return conflictingStatus;
    }

    return UDATPG_NO_CONFLICT;
}